

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,Monom *m)

{
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_stack_ffffffffffffff30
  ;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff38;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff40;
  undefined1 **local_98;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_stack_ffffffffffffff90
  ;
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  in_stack_ffffffffffffff98;
  undefined1 *local_40;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *summands;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffd0;
  
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_40 = &stack0xffffffffffffff90;
  summands = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)0x1;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  Polynom(in_stack_ffffffffffffffd0,summands);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
            (in_stack_ffffffffffffff30);
  local_98 = &local_40;
  do {
    local_98 = local_98 + -6;
    Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x377464);
  } while (local_98 != (undefined1 **)&stack0xffffffffffffff90);
  return;
}

Assistant:

Polynom<Number>::Polynom(Monom m) 
  : Polynom(
      Stack<Monom>{m})
{  }